

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popt.c
# Opt level: O0

int poptBitsIntersect(poptBits *ap,poptBits b)

{
  poptBits ppVar1;
  uint uVar2;
  int iVar3;
  ulong local_48;
  size_t i;
  size_t nw;
  __pbm_bits rc;
  __pbm_bits *bbits;
  __pbm_bits *abits;
  poptBits b_local;
  poptBits *ap_local;
  
  nw._4_4_ = 0;
  uVar2 = _poptBitsM - 1;
  if (((ap == (poptBits *)0x0) || (b == (poptBits)0x0)) || (iVar3 = _poptBitsNew(ap), iVar3 != 0)) {
    ap_local._4_4_ = 0xffffffec;
  }
  else {
    ppVar1 = *ap;
    for (local_48 = 0; local_48 < (ulong)(uVar2 >> 5) + 1; local_48 = local_48 + 1) {
      ppVar1[local_48].bits[0] = b[local_48].bits[0] & ppVar1[local_48].bits[0];
      nw._4_4_ = ppVar1[local_48].bits[0] | nw._4_4_;
    }
    ap_local._4_4_ = (uint)(nw._4_4_ != 0);
  }
  return ap_local._4_4_;
}

Assistant:

int poptBitsIntersect(poptBits *ap, const poptBits b)
{
    __pbm_bits *abits;
    __pbm_bits *bbits;
    __pbm_bits rc = 0;
    size_t nw = (__PBM_IX(_poptBitsM-1) + 1);
    size_t i;

    if (ap == NULL || b == NULL || _poptBitsNew(ap))
	return POPT_ERROR_NULLARG;
    abits = __PBM_BITS(*ap);
    bbits = __PBM_BITS(b);

    for (i = 0; i < nw; i++) {
        abits[i] &= bbits[i];
	rc |= abits[i];
    }
    return (rc ? 1 : 0);
}